

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O1

void __thiscall libtorrent::aux::socks5::start(socks5 *this,proxy_settings *ps)

{
  resolver_interface *prVar1;
  proxy_type_t pVar2;
  undefined1 uVar3;
  uint16_t uVar4;
  undefined8 uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  undefined8 local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  ::std::__cxx11::string::_M_assign((string *)&this->m_proxy_settings);
  ::std::__cxx11::string::_M_assign((string *)&(this->m_proxy_settings).username);
  ::std::__cxx11::string::_M_assign((string *)&(this->m_proxy_settings).password);
  pVar2 = ps->type;
  uVar3 = ps->field_0x61;
  uVar4 = ps->port;
  *(undefined4 *)((long)&(this->m_proxy_settings).port + 1) = *(undefined4 *)((long)&ps->port + 1);
  (this->m_proxy_settings).type = pVar2;
  (this->m_proxy_settings).field_0x61 = uVar3;
  (this->m_proxy_settings).port = uVar4;
  (this->m_proxy_addr).impl_.data_.v4.sin_port = ps->port << 8 | ps->port >> 8;
  prVar1 = this->m_resolver;
  ::std::__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::socks5,void>
            ((__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (__weak_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2> *)this);
  p_Var6 = p_Stack_30;
  uVar5 = local_38;
  local_38 = 0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58 = (undefined8 *)0x0;
  uStack_50 = 0;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58 = (undefined8 *)operator_new(0x20);
  *local_58 = on_name_lookup;
  local_58[1] = 0;
  local_58[2] = uVar5;
  local_58[3] = p_Var6;
  pcStack_40 = ::std::
               _Function_handler<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&),_std::_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>
               ::_M_invoke;
  local_48 = ::std::
             _Function_handler<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&),_std::_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>
             ::_M_manager;
  (**prVar1->_vptr_resolver_interface)(prVar1,ps,2);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
  }
  return;
}

Assistant:

void socks5::start(aux::proxy_settings const& ps)
{
	m_proxy_settings = ps;

	ADD_OUTSTANDING_ASYNC("socks5::on_name_lookup");
	m_proxy_addr.port(ps.port);
	m_resolver.async_resolve(ps.hostname, aux::resolver_interface::abort_on_shutdown
		, std::bind(&socks5::on_name_lookup, self(), _1, _2));
}